

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mesh_edgebreaker_decoder_impl.cc
# Opt level: O0

bool __thiscall
draco::MeshEdgebreakerDecoderImpl<draco::MeshEdgebreakerTraversalDecoder>::
DecodeAttributeConnectivitiesOnFaceLegacy
          (MeshEdgebreakerDecoderImpl<draco::MeshEdgebreakerTraversalDecoder> *this,
          CornerIndex corner)

{
  bool bVar1;
  ulong uVar2;
  size_type sVar3;
  reference pvVar4;
  undefined4 in_ESI;
  long in_RDI;
  bool is_seam;
  uint32_t i_1;
  uint32_t i;
  CornerIndex opp_corner;
  int c;
  CornerIndex corners [3];
  undefined4 in_stack_ffffffffffffff88;
  int in_stack_ffffffffffffff8c;
  MeshEdgebreakerTraversalDecoder *in_stack_ffffffffffffff90;
  CornerTable *in_stack_ffffffffffffff98;
  CornerIndex in_stack_ffffffffffffffa0;
  uint local_3c;
  uint local_34;
  IndexType<unsigned_int,_draco::CornerIndex_tag_type_> local_2c;
  int local_28;
  undefined4 local_24;
  undefined4 local_20;
  IndexType<unsigned_int,_draco::CornerIndex_tag_type_> local_1c;
  uint local_18;
  uint local_14;
  undefined4 local_4;
  
  local_4 = in_ESI;
  std::unique_ptr<draco::CornerTable,_std::default_delete<draco::CornerTable>_>::operator->
            ((unique_ptr<draco::CornerTable,_std::default_delete<draco::CornerTable>_> *)0x166398);
  local_20 = local_4;
  local_18 = (uint)CornerTable::Next(in_stack_ffffffffffffff98,in_stack_ffffffffffffffa0);
  std::unique_ptr<draco::CornerTable,_std::default_delete<draco::CornerTable>_>::operator->
            ((unique_ptr<draco::CornerTable,_std::default_delete<draco::CornerTable>_> *)0x1663be);
  local_24 = local_4;
  local_14 = (uint)CornerTable::Previous(in_stack_ffffffffffffff98,in_stack_ffffffffffffffa0);
  for (local_28 = 0; local_28 < 3; local_28 = local_28 + 1) {
    std::unique_ptr<draco::CornerTable,_std::default_delete<draco::CornerTable>_>::operator->
              ((unique_ptr<draco::CornerTable,_std::default_delete<draco::CornerTable>_> *)0x1663f7)
    ;
    local_2c.value_ =
         (uint)CornerTable::Opposite
                         ((CornerTable *)
                          CONCAT44(in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88),
                          (uint)in_stack_ffffffffffffff90);
    bVar1 = IndexType<unsigned_int,_draco::CornerIndex_tag_type_>::operator==
                      (&local_2c,
                       (IndexType<unsigned_int,_draco::CornerIndex_tag_type_> *)&kInvalidCornerIndex
                      );
    if (bVar1) {
      for (local_34 = 0;
          sVar3 = std::
                  vector<draco::MeshEdgebreakerDecoderImpl<draco::MeshEdgebreakerTraversalDecoder>::AttributeData,_std::allocator<draco::MeshEdgebreakerDecoderImpl<draco::MeshEdgebreakerTraversalDecoder>::AttributeData>_>
                  ::size((vector<draco::MeshEdgebreakerDecoderImpl<draco::MeshEdgebreakerTraversalDecoder>::AttributeData,_std::allocator<draco::MeshEdgebreakerDecoderImpl<draco::MeshEdgebreakerTraversalDecoder>::AttributeData>_>
                          *)(in_RDI + 0x1f8)), local_34 < sVar3; local_34 = local_34 + 1) {
        std::
        vector<draco::MeshEdgebreakerDecoderImpl<draco::MeshEdgebreakerTraversalDecoder>::AttributeData,_std::allocator<draco::MeshEdgebreakerDecoderImpl<draco::MeshEdgebreakerTraversalDecoder>::AttributeData>_>
        ::operator[]((vector<draco::MeshEdgebreakerDecoderImpl<draco::MeshEdgebreakerTraversalDecoder>::AttributeData,_std::allocator<draco::MeshEdgebreakerDecoderImpl<draco::MeshEdgebreakerTraversalDecoder>::AttributeData>_>
                      *)(in_RDI + 0x1f8),(ulong)local_34);
        IndexType<unsigned_int,_draco::CornerIndex_tag_type_>::value(&local_1c + local_28);
        std::vector<int,_std::allocator<int>_>::push_back
                  ((vector<int,_std::allocator<int>_> *)in_stack_ffffffffffffff90,
                   (value_type_conflict1 *)
                   CONCAT44(in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88));
      }
    }
    else {
      local_3c = 0;
      while( true ) {
        uVar2 = (ulong)local_3c;
        sVar3 = std::
                vector<draco::MeshEdgebreakerDecoderImpl<draco::MeshEdgebreakerTraversalDecoder>::AttributeData,_std::allocator<draco::MeshEdgebreakerDecoderImpl<draco::MeshEdgebreakerTraversalDecoder>::AttributeData>_>
                ::size((vector<draco::MeshEdgebreakerDecoderImpl<draco::MeshEdgebreakerTraversalDecoder>::AttributeData,_std::allocator<draco::MeshEdgebreakerDecoderImpl<draco::MeshEdgebreakerTraversalDecoder>::AttributeData>_>
                        *)(in_RDI + 0x1f8));
        if (sVar3 <= uVar2) break;
        bVar1 = MeshEdgebreakerTraversalDecoder::DecodeAttributeSeam
                          (in_stack_ffffffffffffff90,in_stack_ffffffffffffff8c);
        if (bVar1) {
          pvVar4 = std::
                   vector<draco::MeshEdgebreakerDecoderImpl<draco::MeshEdgebreakerTraversalDecoder>::AttributeData,_std::allocator<draco::MeshEdgebreakerDecoderImpl<draco::MeshEdgebreakerTraversalDecoder>::AttributeData>_>
                   ::operator[]((vector<draco::MeshEdgebreakerDecoderImpl<draco::MeshEdgebreakerTraversalDecoder>::AttributeData,_std::allocator<draco::MeshEdgebreakerDecoderImpl<draco::MeshEdgebreakerTraversalDecoder>::AttributeData>_>
                                 *)(in_RDI + 0x1f8),(ulong)local_3c);
          in_stack_ffffffffffffff90 =
               (MeshEdgebreakerTraversalDecoder *)&pvVar4->attribute_seam_corners;
          IndexType<unsigned_int,_draco::CornerIndex_tag_type_>::value(&local_1c + local_28);
          std::vector<int,_std::allocator<int>_>::push_back
                    ((vector<int,_std::allocator<int>_> *)in_stack_ffffffffffffff90,
                     (value_type_conflict1 *)
                     CONCAT44(in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88));
        }
        local_3c = local_3c + 1;
      }
    }
  }
  return true;
}

Assistant:

bool MeshEdgebreakerDecoderImpl<TraversalDecoder>::
    DecodeAttributeConnectivitiesOnFaceLegacy(CornerIndex corner) {
  // Three corners of the face.
  const CornerIndex corners[3] = {corner, corner_table_->Next(corner),
                                  corner_table_->Previous(corner)};

  for (int c = 0; c < 3; ++c) {
    const CornerIndex opp_corner = corner_table_->Opposite(corners[c]);
    if (opp_corner == kInvalidCornerIndex) {
      // Don't decode attribute seams on boundary edges (every boundary edge
      // is automatically an attribute seam).
      for (uint32_t i = 0; i < attribute_data_.size(); ++i) {
        attribute_data_[i].attribute_seam_corners.push_back(corners[c].value());
      }
      continue;
    }

    for (uint32_t i = 0; i < attribute_data_.size(); ++i) {
      const bool is_seam = traversal_decoder_.DecodeAttributeSeam(i);
      if (is_seam) {
        attribute_data_[i].attribute_seam_corners.push_back(corners[c].value());
      }
    }
  }
  return true;
}